

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

StructText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeStructText
          (StructText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          StructSchema schema,Array<kj::StringTree> *nestedTypeDecls,
          TemplateContext *templateContext)

{
  StringPtr hexId_00;
  Reader proto_00;
  StringPtr unqualifiedParentType;
  StringPtr unqualifiedParentType_00;
  StringPtr unqualifiedParentType_01;
  StringPtr suffix;
  StringPtr fullName_00;
  bool bVar1;
  uint16_t uVar2;
  NullableValue<capnp::schema::Value::Reader> *other;
  Reader *pRVar3;
  uint64_t i;
  size_t sVar4;
  BrandInitializerText *pBVar5;
  StringTree *pSVar6;
  StringTree *pSVar7;
  CappedArray<char,_17UL> *params;
  Schema SVar8;
  char *params_3;
  ArrayPtr<const_char> AVar9;
  char (*params_16) [4];
  char (*params_10) [5];
  char *params_15;
  char (*in_stack_fffffffffffff328) [26];
  anon_class_1_0_00000001 local_b99;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&> local_b98;
  undefined1 local_b90 [95];
  byte local_b31;
  StringTree local_b30;
  StringTree local_af8;
  anon_class_1_0_00000001 local_ab9;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&> local_ab8;
  Array<kj::StringTree> local_ab0;
  Schema local_a98;
  char *pcStack_a90;
  ArrayPtr<const_char> local_a88;
  StringTree local_a78;
  anon_class_1_0_00000001 local_a39;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&> local_a38;
  Array<kj::StringTree> local_a30;
  Schema local_a18;
  char *pcStack_a10;
  ArrayPtr<const_char> local_a08;
  StringTree local_9f8;
  anon_class_1_0_00000001 local_9b9;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&> local_9b8;
  Array<kj::StringTree> local_9b0;
  Schema local_998;
  char *pcStack_990;
  ArrayPtr<const_char> local_980;
  StringTree local_970;
  anon_class_1_0_00000001 local_931;
  Mapper<kj::Array<kj::StringTree>_&> local_930;
  undefined1 local_928 [88];
  Mapper<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader> local_8d0;
  Array<kj::StringTree> local_8a0;
  StringTree local_888;
  StringPtr local_850;
  StringTree local_840;
  StringTree local_808;
  ArrayPtr<const_char> local_7d0;
  StringTree local_7c0;
  char *local_788;
  ArrayPtr<const_char> local_780;
  Maybe<capnp::InterfaceSchema::Method> local_770;
  Schema local_728;
  CppTypeName local_720;
  undefined1 local_6e0 [8];
  CppTypeName whichName;
  StringTree local_668;
  StringTree local_630;
  BrandInitializerText local_5f8;
  String local_548;
  StringPtr local_530;
  StringPtr local_520;
  StringTree local_510;
  StringTree local_4d8;
  StringTree local_4a0;
  StringTree local_468;
  byte local_429;
  CapnpcCppMain *pCStack_428;
  bool hasDeps;
  undefined1 local_420 [8];
  BrandInitializerText brandInitializers;
  StringTree defineText;
  undefined1 local_330 [8];
  StringTree declareText;
  undefined1 local_2c0 [8];
  String templates;
  CappedArray<char,_17UL> hexId;
  undefined1 local_280 [4];
  uint discrimOffset;
  Reader structNode;
  FieldList local_238;
  Mapper<capnp::StructSchema::FieldList> local_200;
  undefined1 local_1c8 [8];
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> fieldTexts;
  String subScope;
  StringTree local_188;
  undefined1 local_150 [8];
  String fullName;
  Maybe<capnp::schema::Value::Reader> local_e0;
  undefined1 local_a8 [8];
  NullableValue<capnp::schema::Value::Reader> annotatedName;
  Reader proto;
  CapnpcCppMain *this_local;
  StructSchema schema_local;
  StringPtr name_local;
  StringPtr scope_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  SVar8.raw = (RawBrandedSchema *)name.content.ptr;
  name_local.content.size_ = (size_t)scope.content.ptr;
  this_local = (CapnpcCppMain *)schema.super_Schema.raw;
  schema_local.super_Schema.raw = (Schema)(Schema)SVar8.raw;
  Schema::getProto((Reader *)&annotatedName.field_1.value._reader.nestingLimit,(Schema *)&this_local
                  );
  proto_00._reader.capTable._0_4_ = (int)proto._reader.segment;
  proto_00._reader.segment = (SegmentReader *)annotatedName.field_1._40_8_;
  proto_00._reader.capTable._4_4_ = (int)((ulong)proto._reader.segment >> 0x20);
  proto_00._reader.data = proto._reader.capTable;
  proto_00._reader.pointers = (WirePointer *)proto._reader.data;
  proto_00._reader._32_8_ = proto._reader.pointers;
  proto_00._reader._40_8_ = proto._reader._32_8_;
  annotationValue<capnp::schema::Node::Reader>(&local_e0,this,proto_00,0xf264a779fef191ce);
  other = kj::_::readMaybe<capnp::schema::Value::Reader>(&local_e0);
  kj::_::NullableValue<capnp::schema::Value::Reader>::NullableValue
            ((NullableValue<capnp::schema::Value::Reader> *)local_a8,other);
  kj::Maybe<capnp::schema::Value::Reader>::~Maybe(&local_e0);
  pRVar3 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_a8);
  AVar9.size_ = (size_t)name_local.content.ptr;
  AVar9.ptr = (char *)fullName.content.disposer;
  if (pRVar3 != (Reader *)0x0) {
    pRVar3 = kj::_::NullableValue<capnp::schema::Value::Reader>::operator->
                       ((NullableValue<capnp::schema::Value::Reader> *)local_a8);
    AVar9 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(pRVar3);
    schema_local.super_Schema.raw = (Schema)AVar9.ptr;
  }
  name_local.content.ptr = (char *)AVar9.size_;
  fullName.content.disposer = (ArrayDisposer *)AVar9.ptr;
  kj::_::NullableValue<capnp::schema::Value::Reader>::~NullableValue
            ((NullableValue<capnp::schema::Value::Reader> *)local_a8);
  kj::StringPtr::StringPtr((StringPtr *)&subScope.content.disposer,(void *)0x0);
  pSVar7 = &local_188;
  TemplateContext::args(pSVar7,templateContext,(StringPtr)stack0xfffffffffffffe68);
  kj::str<kj::StringPtr&,kj::StringPtr&,kj::StringTree>
            ((String *)local_150,(kj *)&name_local.content.size_,(StringPtr *)&schema_local,
             (StringPtr *)pSVar7,(StringTree *)SVar8.raw);
  kj::StringTree::~StringTree(&local_188);
  kj::str<kj::String&,char_const(&)[3]>
            ((String *)&fieldTexts.disposer,(kj *)local_150,(String *)0x4184d9,(char (*) [3])pSVar7)
  ;
  StructSchema::getFields(&local_238,(StructSchema *)&this_local);
  kj::_::Mapper<capnp::StructSchema::FieldList>::Mapper(&local_200,&local_238);
  structNode._reader._40_8_ = this;
  kj::_::Mapper<capnp::StructSchema::FieldList>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2010:23)>
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)local_1c8,&local_200,
             (anon_class_24_3_6b8bcf66 *)&structNode._reader.nestingLimit);
  capnp::schema::Node::Reader::getStruct
            ((Reader *)local_280,(Reader *)&annotatedName.field_1.value._reader.nestingLimit);
  hexId._28_4_ = capnp::schema::Node::Struct::Reader::getDiscriminantOffset((Reader *)local_280);
  i = capnp::schema::Node::Reader::getId
                ((Reader *)&annotatedName.field_1.value._reader.nestingLimit);
  kj::hex((CappedArray<char,_17UL> *)&templates.content.disposer,i);
  TemplateContext::allDecls((StringTree *)&declareText.branches.disposer,templateContext);
  kj::str<kj::StringTree>((String *)local_2c0,(StringTree *)&declareText.branches.disposer);
  kj::StringTree::~StringTree((StringTree *)&declareText.branches.disposer);
  defineText.branches.disposer._6_2_ =
       capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_280);
  defineText.branches.disposer._4_2_ =
       capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_280);
  kj::
  strTree<char_const(&)[58],kj::CappedArray<char,17ul>&,char_const(&)[3],unsigned_short,char_const(&)[3],unsigned_short,char_const(&)[3]>
            ((StringTree *)local_330,
             (kj *)"  struct _capnpPrivate {\n    CAPNP_DECLARE_STRUCT_HEADER(",
             (char (*) [58])&templates.content.disposer,(CappedArray<char,_17UL> *)0x4197eb,
             (char (*) [3])((long)&defineText.branches.disposer + 6),(unsigned_short *)0x4197eb,
             (char (*) [3])((long)&defineText.branches.disposer + 4),(unsigned_short *)")\n",
             (char (*) [3])proto._reader.capTable);
  params_16 = (char (*) [4])local_150;
  params_15 = "constexpr ::capnp::_::RawSchema const* ";
  params_10 = (char (*) [5])local_2c0;
  params_3 = "constexpr uint16_t ";
  pSVar7 = (StringTree *)0x418bbb;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],kj::String&,char_const(&)[20],kj::String&,char_const(&)[32],kj::String&,char_const(&)[20],kj::String&,char_const(&)[48],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            ((StringTree *)&brandInitializers.dependencyCount,(kj *)"// ",params_16,
             (String *)0x418bbb,(char (*) [2])params_10,(String *)"constexpr uint16_t ",
             (char (*) [20])params_16,(String *)"::_capnpPrivate::dataWordSize;\n",
             (char (*) [32])params_10,(String *)"constexpr uint16_t ",(char (*) [20])params_16,
             (String *)"::_capnpPrivate::pointerCount;\n#if !CAPNP_LITE\n",(char (*) [48])params_10,
             (String *)"constexpr ::capnp::Kind ",(char (*) [25])params_16,
             (String *)"::_capnpPrivate::kind;\n",(char (*) [24])params_10,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])params_16,
             (String *)"::_capnpPrivate::schema;\n",in_stack_fffffffffffff328);
  bVar1 = TemplateContext::isGeneric(templateContext);
  if (bVar1) {
    pCStack_428 = this_local;
    makeBrandInitializers((BrandInitializerText *)local_420,this,templateContext,(Schema)this_local)
    ;
    sVar4 = kj::StringTree::size((StringTree *)&brandInitializers.bindings.branches.disposer);
    local_429 = sVar4 != 0;
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)local_330);
    makeGenericDeclarations(&local_4a0,this,templateContext,(bool)(local_429 & 1));
    kj::strTree<kj::StringTree,char_const(&)[21],kj::StringTree,char_const(&)[28]>
              (&local_468,(kj *)pSVar7,(StringTree *)"    #if !CAPNP_LITE\n",
               (char (*) [21])&local_4a0,(StringTree *)0x418a1a,(char (*) [28])params_3);
    kj::StringTree::operator=((StringTree *)local_330,&local_468);
    kj::StringTree::~StringTree(&local_468);
    kj::StringTree::~StringTree(&local_4a0);
    pSVar7 = kj::mv<kj::StringTree>((StringTree *)&brandInitializers.dependencyCount);
    kj::StringPtr::StringPtr(&local_520,(String *)local_150);
    kj::str<kj::CappedArray<char,17ul>&>(&local_548,(kj *)&templates.content.disposer,params);
    kj::StringPtr::StringPtr(&local_530,&local_548);
    pBVar5 = kj::mv<capnp::(anonymous_namespace)::CapnpcCppMain::BrandInitializerText>
                       ((BrandInitializerText *)local_420);
    BrandInitializerText::BrandInitializerText(&local_5f8,pBVar5);
    fullName_00.content.size_ = local_520.content.size_;
    fullName_00.content.ptr = local_520.content.ptr;
    hexId_00.content.size_._0_4_ = (int)local_530.content.size_;
    hexId_00.content.ptr = local_530.content.ptr;
    hexId_00.content.size_._4_4_ = (int)(local_530.content.size_ >> 0x20);
    makeGenericDefinitions(&local_510,this,templateContext,fullName_00,hexId_00,&local_5f8);
    kj::strTree<kj::StringTree,kj::StringTree>
              (&local_4d8,(kj *)pSVar7,&local_510,(StringTree *)local_520.content.ptr);
    kj::StringTree::operator=((StringTree *)&brandInitializers.dependencyCount,&local_4d8);
    kj::StringTree::~StringTree(&local_4d8);
    kj::StringTree::~StringTree(&local_510);
    BrandInitializerText::~BrandInitializerText(&local_5f8);
    kj::String::~String(&local_548);
    BrandInitializerText::~BrandInitializerText((BrandInitializerText *)local_420);
    pSVar7 = (StringTree *)local_520.content.ptr;
    params_16 = (char (*) [4])local_530.content.ptr;
  }
  else {
    pSVar6 = kj::mv<kj::StringTree>((StringTree *)local_330);
    kj::strTree<kj::StringTree,char_const(&)[147]>
              (&local_630,(kj *)pSVar6,
               (StringTree *)
               "    #if !CAPNP_LITE\n    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n    #endif  // !CAPNP_LITE\n"
               ,(char (*) [147])pSVar7);
    kj::StringTree::operator=((StringTree *)local_330,&local_630);
    kj::StringTree::~StringTree(&local_630);
  }
  pSVar6 = kj::mv<kj::StringTree>((StringTree *)local_330);
  kj::strTree<kj::StringTree,char_const(&)[5]>
            (&local_668,(kj *)pSVar6,(StringTree *)"  };",(char (*) [5])pSVar7);
  kj::StringTree::operator=((StringTree *)local_330,&local_668);
  kj::StringTree::~StringTree(&local_668);
  pSVar6 = kj::mv<kj::StringTree>((StringTree *)&brandInitializers.dependencyCount);
  kj::strTree<kj::StringTree,char_const(&)[25]>
            ((StringTree *)&whichName.isArgDependent,(kj *)pSVar6,(StringTree *)0x418e2f,
             (char (*) [25])pSVar7);
  kj::StringTree::operator=
            ((StringTree *)&brandInitializers.dependencyCount,
             (StringTree *)&whichName.isArgDependent);
  kj::StringTree::~StringTree((StringTree *)&whichName.isArgDependent);
  CppTypeName::CppTypeName((CppTypeName *)local_6e0);
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_280);
  if (uVar2 != 0) {
    local_728.raw = (RawBrandedSchema *)this_local;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_770,(void *)0x0);
    cppFullName(&local_720,this,local_728,&local_770);
    CppTypeName::operator=((CppTypeName *)local_6e0,&local_720);
    CppTypeName::~CppTypeName(&local_720);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_770);
    kj::StringPtr::StringPtr((StringPtr *)&local_780,"Which");
    CppTypeName::addMemberType((CppTypeName *)local_6e0,(StringPtr)local_780);
  }
  bVar1 = TemplateContext::hasParams(templateContext);
  local_788 = "";
  if (bVar1) {
    local_788 = "  ";
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_7d0,(void *)0x0);
  TemplateContext::decl(&local_7c0,templateContext,true,(StringPtr)local_7d0);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_788,(char **)&local_7c0,
             (StringTree *)"  struct ",(char (*) [10])&schema_local,(StringPtr *)0x4197d1,
             (char (*) [3])params_16);
  TemplateContext::parentDecls(&local_808,templateContext);
  bVar1 = kj::StringPtr::operator==((StringPtr *)&name_local.content.size_,(void *)0x0);
  kj::StringPtr::StringPtr(&local_850,(void *)0x0);
  suffix.content.size_ = local_850.content.size_;
  suffix.content.ptr = local_850.content.ptr;
  TemplateContext::decl(&local_840,templateContext,bVar1,suffix);
  local_928[0x1f] = 0;
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_280);
  if (uVar2 == 0) {
    kj::strTree<>();
  }
  else {
    capnp::schema::Node::Struct::Reader::getFields((Reader *)(local_928 + 0x28),(Reader *)local_280)
    ;
    kj::_::Mapper<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader>::Mapper
              (&local_8d0,(Reader *)(local_928 + 0x28));
    local_928._32_8_ = this;
    kj::_::Mapper<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2079:15)>
              (&local_8a0,&local_8d0,(anon_class_8_1_8991fb9c *)(local_928 + 0x20));
    local_928[0x1f] = 1;
    kj::strTree<char_const(&)[26],kj::Array<kj::StringTree>,char_const(&)[6]>
              (&local_888,(kj *)"  enum Which: uint16_t {\n",(char (*) [26])&local_8a0,
               (Array<kj::StringTree> *)"  };\n",(char (*) [6])local_850.content.size_);
  }
  kj::_::Mapper<kj::Array<kj::StringTree>_&>::Mapper(&local_930,nestedTypeDecls);
  kj::_::Mapper<kj::Array<kj::StringTree>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2087:11)>
            ((Array<kj::StringTree> *)local_928,&local_930,&local_931);
  pSVar7 = kj::mv<kj::StringTree>((StringTree *)local_330);
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[66],kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[2],char_const(&)[5]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&local_808,&local_840,
             (StringTree *)0x418a43,(char (*) [8])&name_local.content.size_,
             (StringPtr *)&schema_local,(StringPtr *)0x41956d,(char (*) [4])0x417f08,
             (char (*) [3])&schema_local,
             (StringPtr *)"() = delete;\n\n  class Reader;\n  class Builder;\n  class Pipeline;\n",
             (char (*) [66])&local_888,(StringTree *)local_928,(Array<kj::StringTree> *)0x418bbb,
             (char (*) [2])pSVar7,(StringTree *)0x418bbb,(char (*) [2])0x41a1f7,params_10);
  kj::StringPtr::StringPtr((StringPtr *)&local_980,(String *)local_150);
  local_998 = schema_local.super_Schema.raw;
  pcStack_990 = name_local.content.ptr;
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_280);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::Mapper
            (&local_9b8,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)local_1c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2095:25)>
            (&local_9b0,&local_9b8,&local_9b9);
  unqualifiedParentType_01.content.size_ = (size_t)pcStack_990;
  unqualifiedParentType_01.content.ptr = (char *)local_998.raw;
  makeReaderDef(&local_970,this,(StringPtr)local_980,unqualifiedParentType_01,templateContext,
                uVar2 != 0,&local_9b0);
  kj::StringPtr::StringPtr((StringPtr *)&local_a08,(String *)local_150);
  local_a18 = schema_local.super_Schema.raw;
  pcStack_a10 = name_local.content.ptr;
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_280);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::Mapper
            (&local_a38,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)local_1c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2097:26)>
            (&local_a30,&local_a38,&local_a39);
  unqualifiedParentType_00.content.size_ = (size_t)pcStack_a10;
  unqualifiedParentType_00.content.ptr = (char *)local_a18.raw;
  makeBuilderDef(&local_9f8,this,(StringPtr)local_a08,unqualifiedParentType_00,templateContext,
                 uVar2 != 0,&local_a30);
  kj::StringPtr::StringPtr((StringPtr *)&local_a88,(String *)local_150);
  local_a98 = schema_local.super_Schema.raw;
  pcStack_a90 = name_local.content.ptr;
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_280);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::Mapper
            (&local_ab8,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)local_1c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2099:27)>
            (&local_ab0,&local_ab8,&local_ab9);
  unqualifiedParentType.content.size_ = (size_t)pcStack_a90;
  unqualifiedParentType.content.ptr = (char *)local_a98.raw;
  SVar8.raw = local_a98.raw;
  makePipelineDef(&local_a78,this,(StringPtr)local_a88,unqualifiedParentType,templateContext,
                  uVar2 != 0,&local_ab0);
  pSVar7 = &local_a78;
  kj::strTree<kj::StringTree,kj::StringTree,kj::StringTree>
            (&__return_storage_ptr__->readerBuilderDefs,(kj *)&local_970,&local_9f8,pSVar7,
             (StringTree *)SVar8.raw);
  local_b31 = 0;
  local_b90[0x1f] = 0;
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount((Reader *)local_280);
  if (uVar2 == 0) {
    kj::strTree<>();
  }
  else {
    TemplateContext::allDecls(&local_b30,templateContext);
    local_b31 = 1;
    TemplateContext::allDecls((StringTree *)(local_b90 + 0x20),templateContext);
    local_b90[0x1f] = 1;
    pSVar7 = (StringTree *)local_6e0;
    kj::
    strTree<kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::String&,char_const(&)[88],unsigned_int&,char_const(&)[29],kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::String&,char_const(&)[84],unsigned_int&,char_const(&)[30]>
              (&local_af8,(kj *)&local_b30,(StringTree *)0x41ae30,(char (*) [8])pSVar7,
               (CppTypeName *)0x417f09,(char (*) [2])local_150,
               (String *)
               "::Reader::which() const {\n  return _reader.getDataField<Which>(\n      ::capnp::bounded<"
               ,(char (*) [88])&hexId.field_0x1c,(uint *)">() * ::capnp::ELEMENTS);\n}\n",
               (char (*) [29])(local_b90 + 0x20),(StringTree *)0x41ae30,(char (*) [8])pSVar7,
               (CppTypeName *)0x417f09,(char (*) [2])local_150,
               (String *)
               "::Builder::which() {\n  return _builder.getDataField<Which>(\n      ::capnp::bounded<"
               ,(char (*) [84])&hexId.field_0x1c,(uint *)">() * ::capnp::ELEMENTS);\n}\n\n",
               (char (*) [30])params_15);
  }
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::Mapper
            (&local_b98,(Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)local_1c8);
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2114:11)>
            ((Array<kj::StringTree> *)local_b90,&local_b98,&local_b99);
  kj::strTree<kj::StringTree,kj::Array<kj::StringTree>>
            (&__return_storage_ptr__->inlineMethodDefs,(kj *)&local_af8,(StringTree *)local_b90,
             (Array<kj::StringTree> *)pSVar7);
  pSVar7 = &__return_storage_ptr__->sourceDefs;
  pSVar6 = kj::mv<kj::StringTree>((StringTree *)&brandInitializers.dependencyCount);
  kj::StringTree::StringTree(pSVar7,pSVar6);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_b90);
  kj::StringTree::~StringTree(&local_af8);
  if ((local_b90[0x1f] & 1) != 0) {
    kj::StringTree::~StringTree((StringTree *)(local_b90 + 0x20));
  }
  if ((local_b31 & 1) != 0) {
    kj::StringTree::~StringTree(&local_b30);
  }
  kj::StringTree::~StringTree(&local_a78);
  kj::Array<kj::StringTree>::~Array(&local_ab0);
  kj::StringTree::~StringTree(&local_9f8);
  kj::Array<kj::StringTree>::~Array(&local_a30);
  kj::StringTree::~StringTree(&local_970);
  kj::Array<kj::StringTree>::~Array(&local_9b0);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_928);
  kj::StringTree::~StringTree(&local_888);
  if ((local_928[0x1f] & 1) != 0) {
    kj::Array<kj::StringTree>::~Array(&local_8a0);
  }
  kj::StringTree::~StringTree(&local_840);
  kj::StringTree::~StringTree(&local_808);
  kj::StringTree::~StringTree(&local_7c0);
  CppTypeName::~CppTypeName((CppTypeName *)local_6e0);
  kj::StringTree::~StringTree((StringTree *)&brandInitializers.dependencyCount);
  kj::StringTree::~StringTree((StringTree *)local_330);
  kj::String::~String((String *)local_2c0);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>::~Array
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)local_1c8);
  kj::String::~String((String *)&fieldTexts.disposer);
  kj::String::~String((String *)local_150);
  return __return_storage_ptr__;
}

Assistant:

StructText makeStructText(kj::StringPtr scope, kj::StringPtr name, StructSchema schema,
                            kj::Array<kj::StringTree> nestedTypeDecls,
                            const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto fullName = kj::str(scope, name, templateContext.args());
    auto subScope = kj::str(fullName, "::");
    auto fieldTexts = KJ_MAP(f, schema.getFields()) {
      return makeFieldText(subScope, f, templateContext);
    };

    auto structNode = proto.getStruct();
    uint discrimOffset = structNode.getDiscriminantOffset();
    auto hexId = kj::hex(proto.getId());

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_STRUCT_HEADER(", hexId, ", ", structNode.getDataWordCount(), ", ",
         structNode.getPointerCount(), ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        templates, "constexpr uint16_t ", fullName, "::_capnpPrivate::dataWordSize;\n",
        templates, "constexpr uint16_t ", fullName, "::_capnpPrivate::pointerCount;\n"
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          "    #if !CAPNP_LITE\n",
          makeGenericDeclarations(templateContext, hasDeps),
          "    #endif  // !CAPNP_LITE\n");

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
          "    #if !CAPNP_LITE\n"
          "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n"
          "    #endif  // !CAPNP_LITE\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    // Name of the ::Which type, when applicable.
    CppTypeName whichName;
    if (structNode.getDiscriminantCount() != 0) {
      whichName = cppFullName(schema, nullptr);
      whichName.addMemberType("Which");
    }

    return StructText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "  class Reader;\n"
          "  class Builder;\n"
          "  class Pipeline;\n",
          structNode.getDiscriminantCount() == 0 ? kj::strTree() : kj::strTree(
              "  enum Which: uint16_t {\n",
              KJ_MAP(f, structNode.getFields()) {
                if (hasDiscriminantValue(f)) {
                  return kj::strTree("    ", toUpperCase(protoName(f)), ",\n");
                } else {
                  return kj::strTree();
                }
              },
              "  };\n"),
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n",
          "};\n"
          "\n"),

      kj::strTree(
          makeReaderDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                        KJ_MAP(f, fieldTexts) { return kj::mv(f.readerMethodDecls); }),
          makeBuilderDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                         KJ_MAP(f, fieldTexts) { return kj::mv(f.builderMethodDecls); }),
          makePipelineDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                          KJ_MAP(f, fieldTexts) { return kj::mv(f.pipelineMethodDecls); })),

      kj::strTree(
          structNode.getDiscriminantCount() == 0 ? kj::strTree() : kj::strTree(
              templateContext.allDecls(),
              "inline ", whichName, " ", fullName, "::Reader::which() const {\n"
              "  return _reader.getDataField<Which>(\n"
              "      ::capnp::bounded<", discrimOffset, ">() * ::capnp::ELEMENTS);\n"
              "}\n",
              templateContext.allDecls(),
              "inline ", whichName, " ", fullName, "::Builder::which() {\n"
              "  return _builder.getDataField<Which>(\n"
              "      ::capnp::bounded<", discrimOffset, ">() * ::capnp::ELEMENTS);\n"
              "}\n"
              "\n"),
          KJ_MAP(f, fieldTexts) { return kj::mv(f.inlineMethodDefs); }),

      kj::mv(defineText)
    };
  }